

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall
cmCTestSVN::UpdateParser::DoPath(UpdateParser *this,char path_status,char prop_status,string *path)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
  *pmVar1;
  mapped_type *pmVar2;
  char local_81;
  undefined1 local_68 [8];
  string name;
  string dir;
  char status;
  string *path_local;
  char prop_status_local;
  char path_status_local;
  UpdateParser *this_local;
  
  local_81 = prop_status;
  if (path_status != ' ') {
    local_81 = path_status;
  }
  cmsys::SystemTools::GetFilenamePath((string *)((long)&name.field_2 + 8),path);
  cmsys::SystemTools::GetFilenameName((string *)local_68,path);
  switch(local_81) {
  case ' ':
  case '?':
  case 'E':
  default:
    break;
  case 'A':
  case 'D':
  case 'U':
    pmVar1 = &std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
              ::operator[](&(this->SVN->super_cmCTestGlobalVC).Dirs,
                           (key_type *)((long)&name.field_2 + 8))->
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
    ;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
             ::operator[](pmVar1,(key_type *)local_68);
    pmVar2->Status = PathUpdated;
    break;
  case 'C':
    pmVar1 = &std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
              ::operator[](&(this->SVN->super_cmCTestGlobalVC).Dirs,
                           (key_type *)((long)&name.field_2 + 8))->
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
    ;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
             ::operator[](pmVar1,(key_type *)local_68);
    pmVar2->Status = PathConflicting;
    break;
  case 'G':
    pmVar1 = &std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
              ::operator[](&(this->SVN->super_cmCTestGlobalVC).Dirs,
                           (key_type *)((long)&name.field_2 + 8))->
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
    ;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
             ::operator[](pmVar1,(key_type *)local_68);
    pmVar2->Status = PathModified;
  }
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void DoPath(char path_status, char prop_status, std::string const& path)
  {
    char status = (path_status != ' ') ? path_status : prop_status;
    std::string dir = cmSystemTools::GetFilenamePath(path);
    std::string name = cmSystemTools::GetFilenameName(path);
    // See "svn help update".
    switch (status) {
      case 'G':
        this->SVN->Dirs[dir][name].Status = PathModified;
        break;
      case 'C':
        this->SVN->Dirs[dir][name].Status = PathConflicting;
        break;
      case 'A':
      case 'D':
      case 'U':
        this->SVN->Dirs[dir][name].Status = PathUpdated;
        break;
      case 'E': // TODO?
      case '?':
      case ' ':
      default:
        break;
    }
  }